

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

string * __thiscall
vkt::sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
          (string *__return_storage_ptr__,void *this,DataType *matType,char *varName)

{
  ostream *poVar1;
  ostringstream local_1a0 [8];
  ostringstream op;
  char *varName_local;
  DataType *matType_local;
  ShaderMatrixCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  switch(*matType) {
  case TYPE_FLOAT:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"");
    break;
  case TYPE_FLOAT_VEC2:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,".x, ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,".y, ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,".x");
    break;
  case TYPE_FLOAT_VEC3:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    std::operator<<(poVar1,"");
    break;
  case TYPE_FLOAT_VEC4:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,".x, ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,".y, ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,".z+");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,".w");
    break;
  case TYPE_FLOAT_MAT2:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0][0], ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1][0], ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[0][1]+");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[1][1]");
    break;
  case TYPE_FLOAT_MAT2X3:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0] + ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[1]");
    break;
  case TYPE_FLOAT_MAT2X4:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0].xyz + ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[1].yzw");
    break;
  case TYPE_FLOAT_MAT3X2:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0][0]+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[0][1], ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1][0]+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1][1], ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[2][0]+");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[2][1]");
    break;
  case TYPE_FLOAT_MAT3:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0] + ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1] + ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[2]");
    break;
  case TYPE_FLOAT_MAT3X4:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0].xyz + ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1].yzw + ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[2].zwx");
    break;
  case TYPE_FLOAT_MAT4X2:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0][0]+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[0][1]+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[3][0], ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1][0]+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1][1]+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[3][1], ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[2][0]+");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[2][1]");
    break;
  case TYPE_FLOAT_MAT4X3:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0] + ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1] + ");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[2] + ");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[3]");
    break;
  case TYPE_FLOAT_MAT4:
    poVar1 = std::operator<<((ostream *)local_1a0,varName);
    poVar1 = std::operator<<(poVar1,"[0].xyz+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[1].yzw+");
    poVar1 = std::operator<<(poVar1,varName);
    poVar1 = std::operator<<(poVar1,"[2].zwx+");
    poVar1 = std::operator<<(poVar1,varName);
    std::operator<<(poVar1,"[3].wxy");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ShaderMatrixCase::genGLSLMatToVec3Reduction (const glu::DataType& matType, const char* varName)
{
	std::ostringstream op;

	switch (matType)
	{
		case TYPE_FLOAT:		op << varName << ", "			<< varName << ", "			<< varName << "";																																			break;
		case TYPE_FLOAT_VEC2:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".x";																																			break;
		case TYPE_FLOAT_VEC3:	op << varName << "";																																																	break;
		case TYPE_FLOAT_VEC4:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".z+"			<< varName << ".w";																												break;
		case TYPE_FLOAT_MAT2:	op << varName << "[0][0], "		<< varName << "[1][0], "	<< varName << "[0][1]+"		<< varName << "[1][1]";																											break;
		case TYPE_FLOAT_MAT2X3:	op << varName << "[0] + "		<< varName << "[1]";																																									break;
		case TYPE_FLOAT_MAT2X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw";																																								break;
		case TYPE_FLOAT_MAT3X2:	op << varName << "[0][0]+"		<< varName << "[0][1], "	<< varName << "[1][0]+"		<< varName << "[1][1], "	<< varName << "[2][0]+" << varName << "[2][1]";														break;
		case TYPE_FLOAT_MAT3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2]";																																		break;
		case TYPE_FLOAT_MAT3X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw + "	<< varName << "[2].zwx";																																	break;
		case TYPE_FLOAT_MAT4X2:	op << varName << "[0][0]+"		<< varName << "[0][1]+"		<< varName << "[3][0], "	<< varName << "[1][0]+"		<< varName << "[1][1]+" << varName << "[3][1], " << varName << "[2][0]+" << varName << "[2][1]";	break;
		case TYPE_FLOAT_MAT4X3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2] + "		<< varName << "[3]";																											break;
		case TYPE_FLOAT_MAT4:	op << varName << "[0].xyz+"		<< varName << "[1].yzw+"	<< varName << "[2].zwx+"	<< varName << "[3].wxy";																										break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return op.str();
}